

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

int __thiscall
mpt::type_properties<mpt::item<mpt::metatype>_>::_init
          (type_properties<mpt::item<mpt::metatype>_> *this,EVP_PKEY_CTX *ctx)

{
  void *src_local;
  void *ptr_local;
  
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    item<mpt::metatype>::item((item<mpt::metatype> *)this,(metatype *)0x0);
  }
  else {
    item<mpt::metatype>::item((item<mpt::metatype> *)this,(item<mpt::metatype> *)ctx);
  }
  return 0;
}

Assistant:

static int _init(void *ptr, const void *src) {
		if (!src) {
			new (ptr) T();
		}
		else {
			new (ptr) T(*static_cast<const T *>(src));
		}
		return 0;
	}